

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O1

void __thiscall Regular::Regular(Regular *this,double rate,Time *time,string *name,string *type)

{
  char *pcVar1;
  long lVar2;
  string local_38;
  
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,name,type);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0015ea90;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__Regular_0015eb28;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__Regular_0015eb70;
  lVar2 = (long)((1.0 / rate) /
                ((this->super_StochasticEventGenerator).super_StochasticVariable.
                 super_StochasticProcess.super_TimeDependent.xTime)->dt);
  pcVar1 = (char *)(this->super_StochasticEventGenerator).super_StochasticVariable.
                   super_StochasticProcess.stochDescription._M_string_length;
  this->regularInterval = lVar2;
  this->regularCount = lVar2;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_StochasticEventGenerator).super_StochasticVariable.
                     super_StochasticProcess.stochDescription,0,pcVar1,0x14e201);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"rate","");
  Parametric::addParameter((Parametric *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Regular::Regular(double rate, Time *time, const string& name, const string& type)
: StochasticEventGenerator(time, name, type)
{
	regularInterval = long(1.0 / rate / xTime->dt);
	regularCount = regularInterval;
	stochDescription = "regular counting process";
	addParameter("rate");
}